

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params *cctxParams,ZSTD_parameters params)

{
  undefined8 uVar1;
  ZSTD_compressionParameters cParams;
  undefined8 *puVar2;
  ZSTD_parameters ZVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  ZSTD_strategy ZVar5;
  undefined4 uStack_24;
  size_t errcod;
  ZSTD_CCtx_params *cctxParams_local;
  
  ZVar3 = params;
  ZVar5 = (ZSTD_strategy)&params;
  uStack_24 = (undefined4)((ulong)&params >> 0x20);
  if (cctxParams == (ZSTD_CCtx_params *)0x0) {
    cctxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  else {
    cParams.targetLength = in_stack_ffffffffffffffd4;
    cParams.windowLog = params.cParams.hashLog;
    cParams.chainLog = params.cParams.searchLog;
    cParams.hashLog = params.cParams.minMatch;
    cParams.searchLog = params.cParams.targetLength;
    cParams.minMatch = params.cParams.strategy;
    cParams.strategy = ZVar5;
    params = ZVar3;
    cctxParams_local = (ZSTD_CCtx_params *)ZSTD_checkCParams(cParams);
    uVar4 = ERR_isError((size_t)cctxParams_local);
    if (uVar4 == 0) {
      memset(cctxParams,0,0x80);
      puVar2 = (undefined8 *)CONCAT44(uStack_24,ZVar5);
      uVar1 = *puVar2;
      (cctxParams->cParams).windowLog = (int)uVar1;
      (cctxParams->cParams).chainLog = (int)((ulong)uVar1 >> 0x20);
      uVar1 = puVar2[1];
      (cctxParams->cParams).hashLog = (int)uVar1;
      (cctxParams->cParams).searchLog = (int)((ulong)uVar1 >> 0x20);
      uVar1 = puVar2[2];
      (cctxParams->cParams).minMatch = (int)uVar1;
      (cctxParams->cParams).targetLength = (int)((ulong)uVar1 >> 0x20);
      (cctxParams->cParams).strategy = *(ZSTD_strategy *)(puVar2 + 3);
      uVar1 = *(undefined8 *)((long)puVar2 + 0x1c);
      (cctxParams->fParams).contentSizeFlag = (int)uVar1;
      (cctxParams->fParams).checksumFlag = (int)((ulong)uVar1 >> 0x20);
      (cctxParams->fParams).noDictIDFlag = *(int *)((long)puVar2 + 0x24);
      cctxParams->compressionLevel = 3;
      cctxParams_local = (ZSTD_CCtx_params *)0x0;
    }
  }
  return (size_t)cctxParams_local;
}

Assistant:

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params* cctxParams, ZSTD_parameters params)
{
    if (!cctxParams) { return ERROR(GENERIC); }
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params.cParams;
    cctxParams->fParams = params.fParams;
    cctxParams->compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(params.cParams));
    return 0;
}